

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_test.c
# Opt level: O0

void redtest(char *ifname,char *ifname2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  undefined8 uVar4;
  int local_2c;
  int local_28;
  int iloop;
  int oloop;
  int j;
  int i;
  int cnt;
  char *ifname2_local;
  char *ifname_local;
  
  printf("Starting Redundant test\n");
  iVar3 = ec_init_redundant(ifname,ifname2);
  if (iVar3 == 0) {
    printf("No socket connection on %s\nExcecute as root\n",ifname);
  }
  else {
    printf("ec_init on %s succeeded.\n",ifname);
    iVar3 = ec_config(0,IOmap);
    if (iVar3 < 1) {
      printf("No slaves found!\n");
    }
    else {
      printf("%d slaves found and configured.\n",(ulong)_ec_slavecount);
      ec_statecheck(0,4,2000000);
      ec_configdc();
      ec_readstate();
      for (j = 1; j <= (int)_ec_slavecount; j = j + 1) {
        printf("Slave:%d Name:%s Output size:%3dbits Input size:%3dbits State:%2d delay:%d.%d\n",
               (ulong)(uint)j,(long)j * 0x148 + 0x107200,
               (ulong)*(ushort *)(__cxa_finalize + (long)j * 0x148),
               (ulong)*(ushort *)(&DAT_00107112 + (long)j * 0x148),
               (ulong)*(ushort *)(&ec_slave + (long)j * 0x148),
               *(undefined4 *)((long)j * 0x148 + 0x1071d4),
               (uint)(byte)(&DAT_001071b9)[(long)j * 0x148]);
        printf("         Out:%8.8x,%4d In:%8.8x,%4d\n",
               *(undefined8 *)(&DAT_00107108 + (long)j * 0x148),
               (ulong)*(uint *)(&DAT_00107104 + (long)j * 0x148),
               *(undefined8 *)(&DAT_00107118 + (long)j * 0x148),
               (ulong)*(uint *)(&DAT_00107114 + (long)j * 0x148));
        if ((digout == (uint8 *)0x0) &&
           ((*(int *)((long)j * 0x148 + 0x1070f4) == 0xaf83052 ||
            (*(int *)((long)j * 0x148 + 0x1070f4) == 0x7d83052)))) {
          digout = *(uint8 **)(&DAT_00107108 + (long)j * 0x148);
        }
      }
      expectedWKC = (uint)_DAT_0010710e * 2 + (uint)_DAT_00107110;
      printf("Calculated workcounter %d\n",(ulong)(uint)expectedWKC);
      printf("Request operational state for all slaves\n");
      _ec_slave = 8;
      ec_writestate(0);
      dorun = 1;
      ec_statecheck(0,8,2000000);
      local_28 = _DAT_00107104;
      if ((_DAT_00107104 == 0) && (___cxa_finalize != 0)) {
        local_28 = 1;
      }
      if (8 < local_28) {
        local_28 = 8;
      }
      local_2c = _DAT_00107114;
      if ((_DAT_00107114 == 0) && (_DAT_00107112 != 0)) {
        local_2c = 1;
      }
      if (8 < local_2c) {
        local_2c = 8;
      }
      if (_ec_slave == 8) {
        printf("Operational state reached for all slaves.\n");
        inOP = '\x01';
        for (oloop = 1; oloop < 0x1389; oloop = oloop + 1) {
          printf("Processdata cycle %5d , Wck %3d, DCtime %12lld, dt %12lld, O:",(ulong)(uint)dorun,
                 (ulong)(uint)wkc,_ec_DCtime,gl_delta);
          for (iloop = 0; iloop < local_28; iloop = iloop + 1) {
            printf(" %2.2x",(ulong)*(byte *)(CONCAT26(_DAT_0010710e,_DAT_00107108) + (long)iloop));
          }
          printf(" I:");
          for (iloop = 0; iloop < local_2c; iloop = iloop + 1) {
            printf(" %2.2x",(ulong)*(byte *)(_DAT_00107118 + iloop));
          }
          printf("\r");
          fflush(_stdout);
          osal_usleep(20000);
        }
        dorun = 0;
        inOP = '\0';
      }
      else {
        printf("Not all slaves reached operational state.\n");
        ec_readstate();
        for (oloop = 1; oloop <= (int)_ec_slavecount; oloop = oloop + 1) {
          if (*(short *)(&ec_slave + (long)oloop * 0x148) != 8) {
            uVar1 = *(ushort *)(&ec_slave + (long)oloop * 0x148);
            uVar2 = *(ushort *)((long)oloop * 0x148 + 0x1070ea);
            uVar4 = ec_ALstatuscode2string(*(undefined2 *)((long)oloop * 0x148 + 0x1070ea));
            printf("Slave %d State=0x%2.2x StatusCode=0x%4.4x : %s\n",(ulong)(uint)oloop,
                   (ulong)uVar1,(ulong)uVar2,uVar4);
          }
        }
      }
      printf("Request safe operational state for all slaves\n");
      _ec_slave = 4;
      ec_writestate(0);
    }
    printf("End redundant test, close socket\n");
    ec_close();
  }
  return;
}

Assistant:

void redtest(char *ifname, char *ifname2)
{
   int cnt, i, j, oloop, iloop;
   
   printf("Starting Redundant test\n");
   
   /* initialise SOEM, bind socket to ifname */
   if (ec_init_redundant(ifname, ifname2))
   {   
      printf("ec_init on %s succeeded.\n",ifname);
      /* find and auto-config slaves */
      if ( ec_config(FALSE, &IOmap) > 0 )
      {
         printf("%d slaves found and configured.\n",ec_slavecount);
         /* wait for all slaves to reach SAFE_OP state */
         ec_statecheck(0, EC_STATE_SAFE_OP,  EC_TIMEOUTSTATE);
         
         /* configure DC options for every DC capable slave found in the list */
         ec_configdc();
                  
         /* read indevidual slave state and store in ec_slave[] */
         ec_readstate();
         for(cnt = 1; cnt <= ec_slavecount ; cnt++)
         {
            printf("Slave:%d Name:%s Output size:%3dbits Input size:%3dbits State:%2d delay:%d.%d\n",
                  cnt, ec_slave[cnt].name, ec_slave[cnt].Obits, ec_slave[cnt].Ibits,
                  ec_slave[cnt].state, (int)ec_slave[cnt].pdelay, ec_slave[cnt].hasdc);
            printf("         Out:%8.8x,%4d In:%8.8x,%4d\n",
                  (intptr_t)ec_slave[cnt].outputs, ec_slave[cnt].Obytes, (intptr_t)ec_slave[cnt].inputs, ec_slave[cnt].Ibytes);
            /* check for EL2004 or EL2008 */
            if( !digout && ((ec_slave[cnt].eep_id == 0x0af83052) || (ec_slave[cnt].eep_id == 0x07d83052)))
            {
               digout = ec_slave[cnt].outputs;
            }   
         }
         expectedWKC = (ec_group[0].outputsWKC * 2) + ec_group[0].inputsWKC;
         printf("Calculated workcounter %d\n", expectedWKC);

         printf("Request operational state for all slaves\n");
         ec_slave[0].state = EC_STATE_OPERATIONAL;
         /* request OP state for all slaves */
         ec_writestate(0);
         /* activate cyclic process data */
         dorun = 1;
         /* wait for all slaves to reach OP state */
         ec_statecheck(0, EC_STATE_OPERATIONAL,  EC_TIMEOUTSTATE);
         oloop = ec_slave[0].Obytes;
         if ((oloop == 0) && (ec_slave[0].Obits > 0)) oloop = 1;
         if (oloop > 8) oloop = 8;
         iloop = ec_slave[0].Ibytes;
         if ((iloop == 0) && (ec_slave[0].Ibits > 0)) iloop = 1;
         if (iloop > 8) iloop = 8;
         if (ec_slave[0].state == EC_STATE_OPERATIONAL )
         {
            printf("Operational state reached for all slaves.\n");
            inOP = TRUE;
            /* acyclic loop 5000 x 20ms = 10s */
            for(i = 1; i <= 5000; i++)
            {
               printf("Processdata cycle %5d , Wck %3d, DCtime %12lld, dt %12lld, O:",
                  dorun, wkc , ec_DCtime, gl_delta);
               for(j = 0 ; j < oloop; j++)
               {
                  printf(" %2.2x", *(ec_slave[0].outputs + j));
               }
               printf(" I:");
               for(j = 0 ; j < iloop; j++)
               {
                  printf(" %2.2x", *(ec_slave[0].inputs + j));
               }   
               printf("\r");
               fflush(stdout);
               osal_usleep(20000);
            }
            dorun = 0;
            inOP = FALSE;
         }
         else
         {
            printf("Not all slaves reached operational state.\n");
             ec_readstate();
             for(i = 1; i<=ec_slavecount ; i++)
             {
                 if(ec_slave[i].state != EC_STATE_OPERATIONAL)
                 {
                     printf("Slave %d State=0x%2.2x StatusCode=0x%4.4x : %s\n",
                         i, ec_slave[i].state, ec_slave[i].ALstatuscode, ec_ALstatuscode2string(ec_slave[i].ALstatuscode));
                 }
             }
         }         
         printf("Request safe operational state for all slaves\n");
         ec_slave[0].state = EC_STATE_SAFE_OP;
         /* request SAFE_OP state for all slaves */
         ec_writestate(0);
      }
      else
      {
         printf("No slaves found!\n");
      }
      printf("End redundant test, close socket\n");
      /* stop SOEM, close socket */
      ec_close();
   }
   else
   {
      printf("No socket connection on %s\nExcecute as root\n",ifname);
   }   
}